

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-detection.c
# Opt level: O0

void delete_detection_node(coda_detection_node *node)

{
  int local_14;
  int i;
  coda_detection_node *node_local;
  
  if (node->path != (char *)0x0) {
    free(node->path);
  }
  if (node->subnode != (coda_detection_node_struct **)0x0) {
    for (local_14 = 0; local_14 < node->num_subnodes; local_14 = local_14 + 1) {
      delete_detection_node(node->subnode[local_14]);
    }
    free(node->subnode);
  }
  free(node);
  return;
}

Assistant:

static void delete_detection_node(coda_detection_node *node)
{
    int i;

    if (node->path != NULL)
    {
        free(node->path);
    }
    if (node->subnode != NULL)
    {
        for (i = 0; i < node->num_subnodes; i++)
        {
            delete_detection_node(node->subnode[i]);
        }
        free(node->subnode);
    }
    free(node);
}